

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_strategies.cpp
# Opt level: O0

bool __thiscall Clasp::UserConfiguration::addPost(UserConfiguration *this,Solver *s)

{
  bool bVar1;
  uint32 uVar2;
  Solver *in_RSI;
  long *in_RDI;
  Params *in_stack_00000008;
  Lookahead *in_stack_00000010;
  Params p;
  PostPropagator *pp;
  bool ok;
  SolverOpts *x;
  undefined8 in_stack_ffffffffffffff98;
  uint32 prio;
  Solver *in_stack_ffffffffffffffa0;
  Solver *this_00;
  PostPropagator *local_28;
  byte local_19;
  long local_18;
  Solver *local_10;
  
  prio = (uint32)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  local_10 = in_RSI;
  uVar2 = Solver::id(in_RSI);
  local_18 = (**(code **)(*in_RDI + 0x30))(in_RDI,uVar2);
  local_19 = 1;
  bVar1 = Lookahead::isType(*(uint *)(local_18 + 0x18) >> 0x10 & 3);
  if (bVar1) {
    local_28 = Solver::getPost(in_stack_ffffffffffffffa0,prio);
    if (local_28 != (PostPropagator *)0x0) {
      (*(local_28->super_Constraint)._vptr_Constraint[5])(local_28,local_10,1);
    }
    this_00 = (Solver *)&stack0xffffffffffffffcc;
    Lookahead::Params::Params((Params *)this_00,*(ushort *)(local_18 + 0x1a) & Hybrid);
    Lookahead::Params::nant((Params *)this_00,(bool)((byte)(*(uint *)(local_18 + 8) >> 0x15) & 1));
    Lookahead::Params::limit((Params *)this_00,(uint)*(ushort *)(local_18 + 0x18));
    operator_new(0x88);
    Lookahead::Lookahead(in_stack_00000010,in_stack_00000008);
    local_19 = Solver::addPost(this_00,(PostPropagator *)local_10);
  }
  return (bool)(local_19 & 1);
}

Assistant:

bool UserConfiguration::addPost(Solver& s) const {
	const SolverOpts& x = solver(s.id());
	bool  ok            = true;
	if (Lookahead::isType(x.lookType)) {
		PostPropagator* pp = s.getPost(PostPropagator::priority_reserved_look);
		if (pp) { pp->destroy(&s, true); }
		Lookahead::Params p(static_cast<VarType>(x.lookType));
		p.nant(x.heuristic.nant != 0);
		p.limit(x.lookOps);
		ok = s.addPost(new Lookahead(p));
	}
	return ok;
}